

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

int __thiscall
ON_HistoryRecord::GetBoolValues(ON_HistoryRecord *this,int value_id,ON_SimpleArray<bool> *a)

{
  ON_Value *pOVar1;
  
  if (-1 < a->m_capacity) {
    a->m_count = 0;
  }
  pOVar1 = FindValueHelper(this,value_id,1,false);
  if (pOVar1 != (ON_Value *)0x0) {
    ON_SimpleArray<bool>::operator=(a,(ON_SimpleArray<bool> *)(pOVar1 + 1));
  }
  return a->m_count;
}

Assistant:

int ON_HistoryRecord::GetBoolValues( int value_id, ON_SimpleArray<bool>& a ) const
{
  a.SetCount(0);
  const ON_BoolValue* v = static_cast<ON_BoolValue*>(FindValueHelper(value_id,ON_Value::bool_value,0));
  if ( v )
  {
    a = v->m_value;
  }
  return a.Count();
}